

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Int64Range::ByteSizeLong(Int64Range *this)

{
  int iVar1;
  int64 iVar2;
  size_t sVar3;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  Int64Range *this_local;
  
  sStack_18 = 0;
  iVar2 = minvalue(this);
  if (iVar2 != 0) {
    iVar2 = minvalue(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(iVar2);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = maxvalue(this);
  if (iVar2 != 0) {
    iVar2 = maxvalue(this);
    sVar3 = google::protobuf::internal::WireFormatLite::Int64Size(iVar2);
    sStack_18 = sVar3 + 1 + sStack_18;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t Int64Range::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Int64Range)
  size_t total_size = 0;

  // int64 minValue = 1;
  if (this->minvalue() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->minvalue());
  }

  // int64 maxValue = 2;
  if (this->maxvalue() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->maxvalue());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}